

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

void Lib::List<Inferences::ALASCA::FourierMotzkinConf::Rhs>::push
               (Rhs *elem,List<Inferences::ALASCA::FourierMotzkinConf::Rhs> **lst)

{
  Clause *pCVar1;
  Rhs *in_RSI;
  SelectedSummand *in_stack_ffffffffffffff68;
  SelectedSummand *in_stack_ffffffffffffff70;
  List<Inferences::ALASCA::FourierMotzkinConf::Rhs> *in_stack_ffffffffffffffe8;
  
  Kernel::SelectedSummand::SelectedSummand(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  Inferences::ALASCA::FourierMotzkinConf::Rhs::Rhs
            ((Rhs *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pCVar1 = (Clause *)cons(in_RSI,in_stack_ffffffffffffffe8);
  (in_RSI->super_SelectedSummand).super_SelectedLiteral.cl = pCVar1;
  Inferences::ALASCA::FourierMotzkinConf::Rhs::~Rhs((Rhs *)0x405263);
  Kernel::SelectedSummand::~SelectedSummand((SelectedSummand *)0x40526d);
  return;
}

Assistant:

static void push(C elem,List* &lst)
  {
    lst = cons(elem, lst);
  }